

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall QList<QLocale>::reserve(QList<QLocale> *this,qsizetype asize)

{
  bool bVar1;
  QArrayDataPointer<QLocale> *pQVar2;
  qsizetype qVar3;
  QLocale *b;
  Data *pDVar4;
  long in_RSI;
  QArrayDataPointer<QLocale> *in_RDI;
  long in_FS_OFFSET;
  DataPointer detached;
  QArrayDataPointer<QLocale> *in_stack_ffffffffffffff78;
  QFlagsStorage<QArrayData::ArrayOption> f;
  QArrayDataPointer<QLocale> *in_stack_ffffffffffffff80;
  QArrayDataPointer<QLocale> *in_stack_ffffffffffffff88;
  AllocationOption option;
  QGenericArrayOps<QLocale> *in_stack_ffffffffffffff90;
  qsizetype local_40;
  QArrayDataPointer<QLocale> local_38;
  QFlagsStorageHelper<QArrayData::ArrayOption,_4> local_18;
  QFlagsStorageHelper<QArrayData::ArrayOption,_4> local_14;
  longlong local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (QArrayDataPointer<QLocale> *)capacity((QList<QLocale> *)0x4e376f);
  qVar3 = QArrayDataPointer<QLocale>::freeSpaceAtBegin(in_stack_ffffffffffffff88);
  option = (AllocationOption)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  if (in_RSI <= (long)pQVar2 - qVar3) {
    QArrayDataPointer<QLocale>::operator->(in_RDI);
    local_18.super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (QFlagsStorage<QArrayData::ArrayOption>)
         QArrayDataPointer<QLocale>::flags(in_stack_ffffffffffffff80);
    local_14.super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (QFlagsStorage<QArrayData::ArrayOption>)
         QFlags<QArrayData::ArrayOption>::operator&
                   ((QFlags<QArrayData::ArrayOption> *)in_stack_ffffffffffffff80,
                    (ArrayOption)((ulong)in_stack_ffffffffffffff78 >> 0x20));
    bVar1 = ::QFlags::operator_cast_to_bool((QFlags *)&local_14);
    if (bVar1) goto LAB_004e3913;
    QArrayDataPointer<QLocale>::operator->(in_RDI);
    bVar1 = QArrayDataPointer<QLocale>::isShared(in_stack_ffffffffffffff80);
    if (!bVar1) {
      QArrayDataPointer<QLocale>::operator->(in_RDI);
      f.i = (Int)((ulong)in_stack_ffffffffffffff78 >> 0x20);
      QFlags<QArrayData::ArrayOption>::QFlags
                ((QFlags<QArrayData::ArrayOption> *)in_stack_ffffffffffffff80,f.i);
      QArrayDataPointer<QLocale>::setFlag((QArrayDataPointer<QLocale> *)0x4e3817,(ArrayOptions)f.i);
      goto LAB_004e3913;
    }
  }
  local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.ptr = (QLocale *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_40 = size((QList<QLocale> *)in_RDI);
  qMax<long_long>(&local_10,&local_40);
  QArrayDataPointer<QLocale>::QArrayDataPointer
            (pQVar2,(qsizetype)in_RDI,(qsizetype)in_stack_ffffffffffffff90,option);
  pQVar2 = (QArrayDataPointer<QLocale> *)QArrayDataPointer<QLocale>::operator->(&local_38);
  QArrayDataPointer<QLocale>::operator->(in_RDI);
  b = QArrayDataPointer<QLocale>::begin((QArrayDataPointer<QLocale> *)0x4e3897);
  QArrayDataPointer<QLocale>::operator->(in_RDI);
  QArrayDataPointer<QLocale>::end(pQVar2);
  QtPrivate::QGenericArrayOps<QLocale>::copyAppend(in_stack_ffffffffffffff90,b,(QLocale *)pQVar2);
  pDVar4 = QArrayDataPointer<QLocale>::d_ptr(&local_38);
  if (pDVar4 != (Data *)0x0) {
    in_stack_ffffffffffffff78 =
         (QArrayDataPointer<QLocale> *)QArrayDataPointer<QLocale>::operator->(&local_38);
    QFlags<QArrayData::ArrayOption>::QFlags
              ((QFlags<QArrayData::ArrayOption> *)pQVar2,
               (ArrayOption)((ulong)in_stack_ffffffffffffff78 >> 0x20));
    QArrayDataPointer<QLocale>::setFlag
              ((QArrayDataPointer<QLocale> *)0x4e38fa,
               (QFlagsStorageHelper<QArrayData::ArrayOption,_4>)
               SUB84((ulong)in_stack_ffffffffffffff78 >> 0x20,0));
  }
  QArrayDataPointer<QLocale>::swap(pQVar2,in_stack_ffffffffffffff78);
  QArrayDataPointer<QLocale>::~QArrayDataPointer(pQVar2);
LAB_004e3913:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QList<T>::reserve(qsizetype asize)
{
    // capacity() == 0 for immutable data, so this will force a detaching below
    if (asize <= capacity() - d.freeSpaceAtBegin()) {
        if (d->flags() & Data::CapacityReserved)
            return;  // already reserved, don't shrink
        if (!d->isShared()) {
            // accept current allocation, don't shrink
            d->setFlag(Data::CapacityReserved);
            return;
        }
    }

    DataPointer detached(qMax(asize, size()));
    detached->copyAppend(d->begin(), d->end());
    if (detached.d_ptr())
        detached->setFlag(Data::CapacityReserved);
    d.swap(detached);
}